

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml_writer.cpp
# Opt level: O1

void __thiscall
embree::XMLWriter::store(XMLWriter *this,Ref<embree::HairMaterial> *material,ssize_t id)

{
  pointer pcVar1;
  int __oflag;
  undefined1 *local_c8 [2];
  undefined1 local_b8 [16];
  undefined1 *local_a8 [2];
  undefined1 local_98 [16];
  undefined1 *local_88 [2];
  undefined1 local_78 [16];
  undefined1 *local_68 [2];
  undefined1 local_58 [16];
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  local_a8[0] = local_98;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"material","");
  pcVar1 = (material->ptr->super_MaterialNode).super_Node.name._M_dataplus._M_p;
  local_c8[0] = local_b8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_c8,pcVar1,
             pcVar1 + (material->ptr->super_MaterialNode).super_Node.name._M_string_length);
  open(this,(char *)local_a8,(int)id,local_c8);
  if (local_c8[0] != local_b8) {
    operator_delete(local_c8[0]);
  }
  if (local_a8[0] != local_98) {
    operator_delete(local_a8[0]);
  }
  store(this,"code","Hair");
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"parameters","");
  open(this,(char *)local_48,__oflag);
  if (local_48[0] != local_38) {
    operator_delete(local_48[0]);
  }
  store_parm(this,"Kr",&material->ptr->Kr);
  store_parm(this,"Kt",&material->ptr->Kt);
  store_parm(this,"nx",&material->ptr->nx);
  store_parm(this,"ny",&material->ptr->ny);
  local_68[0] = local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"parameters","");
  close(this,(int)(string *)local_68);
  if (local_68[0] != local_58) {
    operator_delete(local_68[0]);
  }
  local_88[0] = local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_88,"material","");
  close(this,(int)(string *)local_88);
  if (local_88[0] != local_78) {
    operator_delete(local_88[0]);
  }
  return;
}

Assistant:

void XMLWriter::store(Ref<HairMaterial> material, ssize_t id)
  {
    open("material",id,material->name);
    store("code","Hair");
    open("parameters");
    store_parm("Kr",material->Kr);
    store_parm("Kt",material->Kt);
    store_parm("nx",material->nx);
    store_parm("ny",material->ny);
    close("parameters");
    close("material");
  }